

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O3

void wr_stores(void)

{
  store_conflict *psVar1;
  uint8_t v;
  object *obj;
  ulong uVar2;
  
  wr_u16b(z_info->store_max);
  if (z_info->store_max != 0) {
    uVar2 = 0;
    do {
      psVar1 = stores;
      if (stores[uVar2].owner == (owner *)0x0) {
        v = '\0';
      }
      else {
        v = (uint8_t)(stores[uVar2].owner)->oidx;
      }
      wr_byte(v);
      wr_byte(psVar1[uVar2].stock_num);
      for (obj = psVar1[uVar2].stock; obj != (object *)0x0; obj = obj->next) {
        wr_item(obj->known);
        wr_item(obj);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < z_info->store_max);
  }
  return;
}

Assistant:

void wr_stores(void)
{
	int i;

	wr_u16b(z_info->store_max);
	for (i = 0; i < z_info->store_max; i++) {
		const struct store *store = &stores[i];
		struct object *obj;

		/* Save the current owner */
		wr_byte((store->owner) ? store->owner->oidx : 0);

		/* Save the stock size */
		wr_byte(store->stock_num);

		/* Save the stock */
		for (obj = store->stock; obj; obj = obj->next) {
			wr_item(obj->known);
			wr_item(obj);
		}
	}
}